

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

RefcountedTemplate * __thiscall
ctemplate::TemplateCache::GetTemplateLocked
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateCacheKey *template_cache_key)

{
  bool bVar1;
  int iVar2;
  TemplateState TVar3;
  iterator iVar4;
  char *pcVar5;
  time_t mtime;
  Template *pTVar6;
  undefined8 *puVar7;
  RefcountedTemplate *pRVar8;
  mapped_type *pmVar9;
  string resolved;
  FileStat statbuf;
  allocator local_f1;
  string local_f0;
  FileStat local_d0;
  
  local_d0.mtime = template_cache_key->first;
  local_d0.length._0_4_ = template_cache_key->second;
  iVar4 = std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->parsed_template_cache_->_M_h,(key_type *)&local_d0);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
      ._M_cur == (__node_type *)0x0) {
    if (this->is_frozen_ != false) {
      return (RefcountedTemplate *)0x0;
    }
    pTVar6 = (Template *)operator_new(0xc0);
    Template::Template(pTVar6,filename,strip,this);
    pmVar9 = std::__detail::
             _Map_base<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->parsed_template_cache_,template_cache_key);
    pRVar8 = (RefcountedTemplate *)operator_new(0x18);
    pRVar8->ptr_ = pTVar6;
    pRVar8->refcount_ = 1;
    (pRVar8->mutex_).mutex_ = 0;
    pmVar9->refcounted_tpl = pRVar8;
    pmVar9->should_reload = false;
    pmVar9->template_type = FILE_BASED;
    goto LAB_00121502;
  }
  pmVar9 = (mapped_type *)
           ((long)iVar4.
                  super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                  ._M_cur + 0x18);
  pRVar8 = *(RefcountedTemplate **)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                   ._M_cur + 0x18);
  if ((*(byte *)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                       ._M_cur + 0x20) & 1) == 0) goto LAB_00121502;
  pcVar5 = Template::original_filename(pRVar8->ptr_);
  std::__cxx11::string::string((string *)&local_d0,pcVar5,&local_f1);
  FindTemplateFilename(&local_f0,this,(string *)&local_d0);
  if ((stat *)local_d0.mtime != &local_d0.internal_statbuf) {
    operator_delete((void *)local_d0.mtime);
  }
  if (*(int *)((long)iVar4.
                     super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                     ._M_cur + 0x24) == 1) {
    Template::template_file(pmVar9->refcounted_tpl->ptr_);
    iVar2 = std::__cxx11::string::compare((char *)&local_f0);
    if (iVar2 == 0) {
      pcVar5 = Template::template_file(pmVar9->refcounted_tpl->ptr_);
      mtime = Template::mtime(pmVar9->refcounted_tpl->ptr_);
      bVar1 = HasTemplateChangedOnDisk(pcVar5,mtime,&local_d0);
      if (!bVar1) goto LAB_00121490;
    }
    pTVar6 = (Template *)operator_new(0xc0);
    Template::Template(pTVar6,filename,strip,this);
    RefcountedTemplate::DecRefN(pmVar9->refcounted_tpl,1);
    puVar7 = (undefined8 *)operator_new(0x18);
    *puVar7 = pTVar6;
    puVar7[1] = 1;
    *(undefined8 **)
     ((long)iVar4.
            super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
            ._M_cur + 0x18) = puVar7;
    *(undefined1 *)
     ((long)iVar4.
            super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
            ._M_cur + 0x20) = 0;
    *(undefined4 *)
     ((long)iVar4.
            super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
            ._M_cur + 0x24) = 1;
  }
LAB_00121490:
  *(undefined1 *)
   ((long)iVar4.
          super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
          ._M_cur + 0x20) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pRVar8 = pmVar9->refcounted_tpl;
LAB_00121502:
  TVar3 = Template::state(pRVar8->ptr_);
  if (TVar3 != TS_READY) {
    return (RefcountedTemplate *)0x0;
  }
  return pmVar9->refcounted_tpl;
}

Assistant:

TemplateCache::RefcountedTemplate* TemplateCache::GetTemplateLocked(
    const TemplateString& filename,
    Strip strip,
    const TemplateCacheKey& template_cache_key) {
  // NOTE: A write-lock must be held on mutex_ when this method is called.
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  if (!it) {
    // If the cache is frozen and the template doesn't already exist in cache,
    // do not load the template, return NULL.
    if (is_frozen_) {
      return NULL;
    }
    // TODO(panicker): Validate the filename here, and if the file can't be
    // resolved then insert a NULL in the cache.
    // If validation succeeds then pass in resolved filename, mtime &
    // file length (from statbuf) to the constructor.
    const Template* tpl = new Template(filename, strip, this);
    it = &(*parsed_template_cache_)[template_cache_key];
    *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    assert(it);
  }
  if (it->should_reload) {
    // check if the template has changed on disk or if a new template with the
    // same name has been added earlier in the search path:
    const string resolved = FindTemplateFilename(
        it->refcounted_tpl->tpl()->original_filename());
    FileStat statbuf;
    if (it->template_type == CachedTemplate::FILE_BASED &&
        (resolved != it->refcounted_tpl->tpl()->template_file() ||
         HasTemplateChangedOnDisk(
             it->refcounted_tpl->tpl()->template_file(),
             it->refcounted_tpl->tpl()->mtime(),
             &statbuf))) {
      // Create a new template, insert it into the cache under
      // template_cache_key, and DecRef() the old one to indicate
      // the cache no longer has a reference to it.
      const Template* tpl = new Template(filename, strip, this);
      // DecRef after creating the new template since DecRef may free up
      // the storage for filename,
      it->refcounted_tpl->DecRef();
      *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    }
    it->should_reload = false;
  }

  // If the state is TS_ERROR, we leave the state as is, but return
  // NULL.  We won't try to load the template file again until the
  // reload status is set to true by another call to ReloadAllIfChanged.
  return it->refcounted_tpl->tpl()->state() == TS_READY ? it->refcounted_tpl : NULL;
}